

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O2

void Curl_llist_move(curl_llist *list,curl_llist_element *e,curl_llist *to_list,
                    curl_llist_element *to_e)

{
  size_t sVar1;
  curl_llist_element **ppcVar2;
  curl_llist *pcVar3;
  curl_llist_element *pcVar4;
  curl_llist *pcVar5;
  
  if ((e != (curl_llist_element *)0x0) && (sVar1 = list->size, sVar1 != 0)) {
    pcVar3 = (curl_llist *)e->next;
    if (list->head == e) {
      pcVar4 = (curl_llist_element *)0x0;
      pcVar5 = list;
    }
    else {
      pcVar4 = e->prev;
      pcVar5 = (curl_llist *)&pcVar4->next;
    }
    pcVar5->head = (curl_llist_element *)pcVar3;
    if (pcVar3 == (curl_llist *)0x0) {
      pcVar3 = list;
    }
    pcVar3->tail = pcVar4;
    list->size = sVar1 - 1;
    sVar1 = to_list->size;
    if (sVar1 == 0) {
      to_list->head = e;
      ppcVar2 = &to_list->tail;
      e->prev = (curl_llist_element *)0x0;
      e->next = (curl_llist_element *)0x0;
    }
    else {
      ppcVar2 = &to_e->next;
      pcVar3 = (curl_llist *)to_e->next;
      e->next = (curl_llist_element *)pcVar3;
      e->prev = to_e;
      if (pcVar3 == (curl_llist *)0x0) {
        pcVar3 = to_list;
      }
      pcVar3->tail = e;
    }
    *ppcVar2 = e;
    to_list->size = sVar1 + 1;
  }
  return;
}

Assistant:

void Curl_llist_move(struct curl_llist *list, struct curl_llist_element *e,
                     struct curl_llist *to_list,
                     struct curl_llist_element *to_e)
{
  /* Remove element from list */
  if(e == NULL || list->size == 0)
    return;

  if(e == list->head) {
    list->head = e->next;

    if(list->head == NULL)
      list->tail = NULL;
    else
      e->next->prev = NULL;
  }
  else {
    e->prev->next = e->next;
    if(!e->next)
      list->tail = e->prev;
    else
      e->next->prev = e->prev;
  }

  --list->size;

  /* Add element to to_list after to_e */
  if(to_list->size == 0) {
    to_list->head = e;
    to_list->head->prev = NULL;
    to_list->head->next = NULL;
    to_list->tail = e;
  }
  else {
    e->next = to_e->next;
    e->prev = to_e;
    if(to_e->next) {
      to_e->next->prev = e;
    }
    else {
      to_list->tail = e;
    }
    to_e->next = e;
  }

  ++to_list->size;
}